

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void gl4cts::CopyImage::Utils::readChannel
               (GLenum type,GLuint channel,GLubyte *pixel,GLdouble *value)

{
  TestError *this;
  GLdouble GVar1;
  
  switch(type) {
  case 0x1400:
    GVar1 = (double)(int)(char)pixel[channel] / 127.0;
    break;
  case 0x1401:
    GVar1 = (double)pixel[channel] / 255.0;
    break;
  case 0x1402:
    GVar1 = (double)(int)*(short *)(pixel + (ulong)channel * 2) / 32767.0;
    break;
  case 0x1403:
    GVar1 = (double)*(ushort *)(pixel + (ulong)channel * 2) / 65535.0;
    break;
  case 0x1404:
    GVar1 = (double)*(int *)(pixel + (ulong)channel * 4) / 2147483647.0;
    break;
  case 0x1405:
    GVar1 = (double)*(uint *)(pixel + (ulong)channel * 4) / 4294967295.0;
    break;
  case 0x1406:
    GVar1 = (GLdouble)*(float *)(pixel + (ulong)channel * 4);
    break;
  case 0x140b:
    readBaseTypeFromHalfFloatChannel(channel,pixel,value);
    return;
  default:
    if (type == 0x8032) {
      read3Channel<unsigned_char,3u,3u,2u,5u,2u,0u>(channel,pixel,value);
      return;
    }
    if (type == 0x8033) {
      read4Channel<unsigned_short,4u,4u,4u,4u,12u,8u,4u,0u>(channel,pixel,value);
      return;
    }
    if (type == 0x8034) {
      read4Channel<unsigned_short,5u,5u,5u,1u,11u,6u,1u,0u>(channel,pixel,value);
      return;
    }
    if (type == 0x8363) {
      read3Channel<unsigned_short,5u,6u,5u,11u,5u,0u>(channel,pixel,value);
      return;
    }
    if (type == 0x8368) {
      read4Channel<unsigned_int,2u,10u,10u,10u,30u,20u,10u,0u>(3 - channel,pixel,value);
      return;
    }
    if (type == 0x8c3b) {
      read11F_11F_10F_Channel(channel,pixel,value);
      return;
    }
    if (type == 0x8c3e) {
      read4Channel<unsigned_int,5u,9u,9u,9u,27u,18u,9u,0u>(3 - channel,pixel,value);
      return;
    }
  case 0x1407:
  case 0x1408:
  case 0x1409:
  case 0x140a:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
               ,0x923);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  *value = GVar1;
  return;
}

Assistant:

void Utils::readChannel(GLenum type, GLuint channel, const GLubyte* pixel, GLdouble& value)
{
	switch (type)
	{
	/* Base types */
	case GL_UNSIGNED_BYTE:
		readBaseTypeFromUnsignedChannel<GLubyte>(channel, pixel, value);
		break;
	case GL_UNSIGNED_SHORT:
		readBaseTypeFromUnsignedChannel<GLushort>(channel, pixel, value);
		break;
	case GL_UNSIGNED_INT:
		readBaseTypeFromUnsignedChannel<GLuint>(channel, pixel, value);
		break;
	case GL_BYTE:
		readBaseTypeFromSignedChannel<GLbyte>(channel, pixel, value);
		break;
	case GL_SHORT:
		readBaseTypeFromSignedChannel<GLshort>(channel, pixel, value);
		break;
	case GL_INT:
		readBaseTypeFromSignedChannel<GLint>(channel, pixel, value);
		break;
	case GL_HALF_FLOAT:
		readBaseTypeFromHalfFloatChannel(channel, pixel, value);
		break;
	case GL_FLOAT:
		readBaseTypeFromFloatChannel(channel, pixel, value);
		break;

	/* Complicated */
	/* 3 channles */
	case GL_UNSIGNED_BYTE_3_3_2:
		read3Channel<GLubyte, 3, 3, 2, 5, 2, 0>(channel, pixel, value);
		break;
	case GL_UNSIGNED_SHORT_5_6_5:
		read3Channel<GLushort, 5, 6, 5, 11, 5, 0>(channel, pixel, value);
		break;

	/* 4 channels */
	case GL_UNSIGNED_SHORT_4_4_4_4:
		read4Channel<GLushort, 4, 4, 4, 4, 12, 8, 4, 0>(channel, pixel, value);
		break;
	case GL_UNSIGNED_SHORT_5_5_5_1:
		read4Channel<GLushort, 5, 5, 5, 1, 11, 6, 1, 0>(channel, pixel, value);
		break;
	case GL_UNSIGNED_INT_2_10_10_10_REV:
		read4Channel<GLuint, 2, 10, 10, 10, 30, 20, 10, 0>(3 - channel, pixel, value);
		break;
	case GL_UNSIGNED_INT_5_9_9_9_REV:
		read4Channel<GLuint, 5, 9, 9, 9, 27, 18, 9, 0>(3 - channel, pixel, value);
		break;

	/* R11F_G11F_B10F - uber complicated */
	case GL_UNSIGNED_INT_10F_11F_11F_REV:
		read11F_11F_10F_Channel(channel, pixel, value);
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}
}